

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O1

domain_manager * __thiscall
cs::domain_manager::add_buildin_var<char_const(&)[11]>
          (domain_manager *this,char (*name) [11],var *var)

{
  size_t sVar1;
  size_t hashval;
  domain_manager *pdVar2;
  char (*key) [11];
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  sVar1 = strlen(*name);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,name,*name + sVar1);
  add_record(this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_48._M_dataplus._M_p =
       (pointer)&(this->buildin_symbols).
                 super_raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .settings_;
  hashval = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::HashElement::operator()((HashElement *)&local_48,name);
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::emplace_decomposable<char[11],char_const(&)[11]>
            ((pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
              *)&local_48,
             (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->buildin_symbols,name,hashval,name);
  pdVar2 = add_var_global<char_const(&)[11]>(this,name,var);
  return pdVar2;
}

Assistant:

domain_manager &add_buildin_var(T &&name, const var &var)
		{
			add_record(name);
			buildin_symbols.emplace(name);
			return add_var_global(name, var);
		}